

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::WFElemStack::addLevel(WFElemStack *this,XMLCh *toSet,uint toSetLen,uint readerNum)

{
  int iVar1;
  StackElem *this_00;
  undefined4 extraout_var;
  uint readerNum_local;
  uint toSetLen_local;
  XMLCh *toSet_local;
  WFElemStack *this_local;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    this_00 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    StackElem::StackElem(this_00);
    this->fStack[this->fStackTop] = this_00;
    this->fStack[this->fStackTop]->fThisElement = (XMLCh *)0x0;
    this->fStack[this->fStackTop]->fElemMaxLength = 0;
  }
  this->fStack[this->fStackTop]->fCurrentURI = this->fUnknownNamespaceId;
  this->fStack[this->fStackTop]->fTopPrefix = -1;
  if (this->fStack[this->fStackTop]->fElemMaxLength < toSetLen) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])
              (this->fMemoryManager,this->fStack[this->fStackTop]->fThisElement);
    this->fStack[this->fStackTop]->fElemMaxLength = toSetLen;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)(toSetLen + 1) << 1);
    this->fStack[this->fStackTop]->fThisElement = (XMLCh *)CONCAT44(extraout_var,iVar1);
  }
  XMLString::moveChars(this->fStack[this->fStackTop]->fThisElement,toSet,(ulong)(toSetLen + 1));
  this->fStack[this->fStackTop]->fReaderNum = readerNum;
  if (this->fStackTop != 0) {
    this->fStack[this->fStackTop]->fTopPrefix = this->fStack[this->fStackTop - 1]->fTopPrefix;
  }
  this->fStackTop = this->fStackTop + 1;
  return this->fStackTop - 1;
}

Assistant:

XMLSize_t
WFElemStack::addLevel(const XMLCh* const toSet,
                      const unsigned int toSetLen,
                      const unsigned int readerNum)
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    // And store the new stuff
    if (toSetLen > fStack[fStackTop]->fElemMaxLength) {

        fMemoryManager->deallocate(fStack[fStackTop]->fThisElement);//delete [] fStack[fStackTop]->fThisElement;
        fStack[fStackTop]->fElemMaxLength = toSetLen;
        fStack[fStackTop]->fThisElement = (XMLCh*) fMemoryManager->allocate
        (
            (toSetLen + 1) * sizeof(XMLCh)
        );//new XMLCh[toSetLen + 1];
    }

    XMLString::moveChars(fStack[fStackTop]->fThisElement, toSet, toSetLen + 1);
    fStack[fStackTop]->fReaderNum = readerNum;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}